

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestCoverageHandler::FindLCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  bool bVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string daGlob;
  string buildDir;
  ostringstream cmCTestLog_msg;
  cmWorkingDirectory workdir;
  Glob gl;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [16];
  undefined1 local_218 [96];
  ios_base local_1b8 [264];
  cmWorkingDirectory local_b0;
  Glob local_88;
  
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = false;
  local_88.RecurseThroughSymlinks = false;
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_228._0_8_ = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_248,pcVar2,(string *)local_228);
  if ((undefined1 *)local_228._0_8_ != local_218) {
    operator_delete((void *)local_228._0_8_,local_218._0_8_ + 1);
  }
  cmWorkingDirectory::cmWorkingDirectory(&local_b0,&local_248);
  if (local_b0.ResultCode == 0) {
    local_228._0_8_ = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"profmerge","");
    bVar3 = cmSystemTools::RunSingleCommand
                      ((string *)local_228,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,
                       OUTPUT_MERGE,(cmDuration)0x0);
    if ((undefined1 *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,local_218._0_8_ + 1);
    }
    if (bVar3) {
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
      local_228._0_8_ = local_248._M_string_length;
      local_228._8_8_ = local_248._M_dataplus._M_p;
      local_218._0_8_ = 6;
      local_218._8_8_ = "/*.dpi";
      views._M_len = 2;
      views._M_array = (iterator)local_228;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      cmCatViews_abi_cxx11_(&local_268,views);
      std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
      paVar1 = &local_268.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"   looking for dpi files in: ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,local_288._M_dataplus._M_p,local_288._M_string_length
                         );
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x66d,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      bVar3 = cmsys::Glob::FindFiles(&local_88,&local_288,(GlobMessages *)0x0);
      if (bVar3) {
        pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                   (files->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Now searching in: ",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,local_288._M_dataplus._M_p,
                            local_288._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x675,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Error while finding files matching ",0x23);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,local_288._M_dataplus._M_p,
                            local_288._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x670,local_268._M_dataplus._M_p,false);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0019866d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Error while running profmerge.\n",0x1f);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x664,local_288._M_dataplus._M_p,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Unable to change working directory to ",0x26);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_228,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x65e,local_288._M_dataplus._M_p,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  bVar3 = false;
LAB_0019866d:
  cmWorkingDirectory::~cmWorkingDirectory(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  return bVar3;
}

Assistant:

bool cmCTestCoverageHandler::FindLCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOff(); // No need of recurse if -prof_dir${BUILD_DIR} flag is
                   // used while compiling.
  gl.RecurseThroughSymlinksOff();
  std::string buildDir = this->CTest->GetCTestConfiguration("BuildDirectory");
  cmWorkingDirectory workdir(buildDir);
  if (workdir.Failed()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to change working directory to " << buildDir
                                                        << std::endl);
    return false;
  }

  // Run profmerge to merge all *.dyn files into dpi files
  if (!cmSystemTools::RunSingleCommand("profmerge")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error while running profmerge.\n");
    return false;
  }

  // DPI file should appear in build directory
  std::string daGlob;
  daGlob = cmStrCat(buildDir, "/*.dpi");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "   looking for dpi files in: " << daGlob << std::endl,
                     this->Quiet);
  if (!gl.FindFiles(daGlob)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding files matching " << daGlob << std::endl);
    return false;
  }
  cm::append(files, gl.GetFiles());
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Now searching in: " << daGlob << std::endl, this->Quiet);
  return true;
}